

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

int skipArgs(char *arg)

{
  int iVar1;
  char *arg_local;
  
  iVar1 = strcmp(arg,"-path");
  if (((((((iVar1 != 0) && (iVar1 = strcmp(arg,"--path"), iVar1 != 0)) &&
         (iVar1 = strcmp(arg,"-maxmem"), iVar1 != 0)) &&
        ((iVar1 = strcmp(arg,"--maxmem"), iVar1 != 0 && (iVar1 = strcmp(arg,"-o"), iVar1 != 0)))) &&
       (iVar1 = strcmp(arg,"-output"), iVar1 != 0)) &&
      (((((iVar1 = strcmp(arg,"--output"), iVar1 != 0 && (iVar1 = strcmp(arg,"-encode"), iVar1 != 0)
          ) && ((iVar1 = strcmp(arg,"--encode"), iVar1 != 0 &&
                (((iVar1 = strcmp(arg,"-pretty"), iVar1 != 0 &&
                  (iVar1 = strcmp(arg,"--pretty"), iVar1 != 0)) &&
                 (iVar1 = strcmp(arg,"-dtdvalid"), iVar1 != 0)))))) &&
        (((iVar1 = strcmp(arg,"--dtdvalid"), iVar1 != 0 &&
          (iVar1 = strcmp(arg,"-dtdvalidfpi"), iVar1 != 0)) &&
         ((iVar1 = strcmp(arg,"--dtdvalidfpi"), iVar1 != 0 &&
          ((((iVar1 = strcmp(arg,"-relaxng"), iVar1 != 0 &&
             (iVar1 = strcmp(arg,"--relaxng"), iVar1 != 0)) &&
            ((iVar1 = strcmp(arg,"-schema"), iVar1 != 0 &&
             (((iVar1 = strcmp(arg,"--schema"), iVar1 != 0 &&
               (iVar1 = strcmp(arg,"-schematron"), iVar1 != 0)) &&
              (iVar1 = strcmp(arg,"--schematron"), iVar1 != 0)))))) &&
           ((iVar1 = strcmp(arg,"-pattern"), iVar1 != 0 &&
            (iVar1 = strcmp(arg,"--pattern"), iVar1 != 0)))))))))) &&
       (iVar1 = strcmp(arg,"-xpath"), iVar1 != 0)))) &&
     (((iVar1 = strcmp(arg,"--xpath"), iVar1 != 0 && (iVar1 = strcmp(arg,"-max-ampl"), iVar1 != 0))
      && (iVar1 = strcmp(arg,"--max-ampl"), iVar1 != 0)))) {
    return 0;
  }
  return 1;
}

Assistant:

static int
skipArgs(const char *arg) {
    if ((!strcmp(arg, "-path")) ||
        (!strcmp(arg, "--path")) ||
        (!strcmp(arg, "-maxmem")) ||
        (!strcmp(arg, "--maxmem")) ||
#ifdef LIBXML_OUTPUT_ENABLED
        (!strcmp(arg, "-o")) ||
        (!strcmp(arg, "-output")) ||
        (!strcmp(arg, "--output")) ||
        (!strcmp(arg, "-encode")) ||
        (!strcmp(arg, "--encode")) ||
        (!strcmp(arg, "-pretty")) ||
        (!strcmp(arg, "--pretty")) ||
#endif
#ifdef LIBXML_VALID_ENABLED
        (!strcmp(arg, "-dtdvalid")) ||
        (!strcmp(arg, "--dtdvalid")) ||
        (!strcmp(arg, "-dtdvalidfpi")) ||
        (!strcmp(arg, "--dtdvalidfpi")) ||
#endif
#ifdef LIBXML_RELAXNG_ENABLED
        (!strcmp(arg, "-relaxng")) ||
        (!strcmp(arg, "--relaxng")) ||
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
        (!strcmp(arg, "-schema")) ||
        (!strcmp(arg, "--schema")) ||
#endif
#ifdef LIBXML_SCHEMATRON_ENABLED
        (!strcmp(arg, "-schematron")) ||
        (!strcmp(arg, "--schematron")) ||
#endif
#if defined(LIBXML_READER_ENABLED) && defined(LIBXML_PATTERN_ENABLED)
        (!strcmp(arg, "-pattern")) ||
        (!strcmp(arg, "--pattern")) ||
#endif
#ifdef LIBXML_XPATH_ENABLED
        (!strcmp(arg, "-xpath")) ||
        (!strcmp(arg, "--xpath")) ||
#endif
        (!strcmp(arg, "-max-ampl")) ||
        (!strcmp(arg, "--max-ampl"))
    ) {
        return(1);
    }